

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webrtc_vad.c
# Opt level: O1

int WebRtcVad_Process(VadInst *handle,int fs,int16_t *audio_frame,size_t frame_length)

{
  int iVar1;
  long lVar2;
  int iVar3;
  VadInstT *self;
  ulong uVar4;
  size_t sVar5;
  
  if (((handle != (VadInst *)0x0) && (audio_frame != (int16_t *)0x0)) &&
     (*(int *)(handle + 0x2dc) == 0x2a)) {
    lVar2 = 0;
    do {
      if (*(int *)((long)kValidRates + lVar2) == fs) {
        uVar4 = 0;
        sVar5 = frame_length;
        do {
          sVar5 = sVar5 + (long)(*(int *)((long)kValidRates + lVar2) / 1000) * -10;
          if (sVar5 == 0) {
            iVar1 = -1;
            if (fs < 32000) {
              if (fs == 8000) {
                iVar1 = WebRtcVad_CalcVad8khz((VadInstT *)handle,audio_frame,frame_length);
              }
              else if (fs == 16000) {
                iVar1 = WebRtcVad_CalcVad16khz((VadInstT *)handle,audio_frame,frame_length);
              }
            }
            else if (fs == 32000) {
              iVar1 = WebRtcVad_CalcVad32khz((VadInstT *)handle,audio_frame,frame_length);
            }
            else if (fs == 48000) {
              iVar1 = WebRtcVad_CalcVad48khz((VadInstT *)handle,audio_frame,frame_length);
            }
            iVar3 = 1;
            if (iVar1 < 1) {
              iVar3 = iVar1;
            }
            return iVar3;
          }
          uVar4 = uVar4 + 10;
        } while (uVar4 < 0x15);
        return -1;
      }
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x10);
  }
  return -1;
}

Assistant:

int WebRtcVad_Process(VadInst* handle, int fs, const int16_t* audio_frame,
                      size_t frame_length) {
  int vad = -1;
  VadInstT* self = (VadInstT*) handle;

  if (handle == NULL) {
    return -1;
  }

  if (self->init_flag != kInitCheck) {
    return -1;
  }
  if (audio_frame == NULL) {
    return -1;
  }
  if (WebRtcVad_ValidRateAndFrameLength(fs, frame_length) != 0) {
    return -1;
  }

  if (fs == 48000) {
      vad = WebRtcVad_CalcVad48khz(self, audio_frame, frame_length);
  } else if (fs == 32000) {
    vad = WebRtcVad_CalcVad32khz(self, audio_frame, frame_length);
  } else if (fs == 16000) {
    vad = WebRtcVad_CalcVad16khz(self, audio_frame, frame_length);
  } else if (fs == 8000) {
    vad = WebRtcVad_CalcVad8khz(self, audio_frame, frame_length);
  }

  if (vad > 0) {
    vad = 1;
  }
  return vad;
}